

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall
wallet::LegacyScriptPubKeyMan::RemoveWatchOnly(LegacyScriptPubKeyMan *this,CScript *dest)

{
  WatchOnlySet *this_00;
  WatchKeyMap *this_01;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<CScript>,_std::_Rb_tree_iterator<CScript>_> pVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>,_std::_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>_>
  pVar5;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock27;
  CPubKey pubKey;
  unique_lock<std::recursive_mutex> local_90;
  CKeyID local_7c;
  undefined1 local_68 [72];
  long local_20;
  WalletDatabase *pWVar3;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_90._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_90._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_90);
  this_00 = &(this->super_LegacyDataSPKM).setWatchOnly;
  pVar4 = std::
          _Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
          ::equal_range(&this_00->_M_t,dest);
  std::
  _Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
  ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
  local_68[0] = 0xff;
  bVar1 = ExtractPubKey(dest,(CPubKey *)local_68);
  if (bVar1) {
    CPubKey::GetID(&local_7c,(CPubKey *)local_68);
    this_01 = &(this->super_LegacyDataSPKM).mapWatchKeys;
    pVar5 = std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
            ::equal_range(&this_01->_M_t,&local_7c);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
    ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_90);
  bVar1 = LegacyDataSPKM::HaveWatchOnly(&this->super_LegacyDataSPKM);
  if (!bVar1) {
    boost::signals2::
    signal<void_(bool),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(bool)>,_boost::function<void_(const_boost::signals2::connection_&,_bool)>,_boost::signals2::mutex>
    ::operator()(&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan.NotifyWatchonlyChanged,false);
  }
  iVar2 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  pWVar3 = (WalletDatabase *)CONCAT44(extraout_var,iVar2);
  (*pWVar3->_vptr_WalletDatabase[0xe])((WalletBatch *)local_68,pWVar3,1);
  local_68._8_8_ = pWVar3;
  bVar1 = WalletBatch::EraseWatchOnly((WalletBatch *)local_68,dest);
  if ((long *)CONCAT71(local_68._1_7_,local_68[0]) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_68._1_7_,local_68[0]) + 0x28))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::RemoveWatchOnly(const CScript &dest)
{
    {
        LOCK(cs_KeyStore);
        setWatchOnly.erase(dest);
        CPubKey pubKey;
        if (ExtractPubKey(dest, pubKey)) {
            mapWatchKeys.erase(pubKey.GetID());
        }
        // Related CScripts are not removed; having superfluous scripts around is
        // harmless (see comment in ImplicitlyLearnRelatedKeyScripts).
    }

    if (!HaveWatchOnly())
        NotifyWatchonlyChanged(false);
    if (!WalletBatch(m_storage.GetDatabase()).EraseWatchOnly(dest))
        return false;

    return true;
}